

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O3

QString * __thiscall
QLocale::name(QString *__return_storage_ptr__,QLocale *this,TagSeparator separator)

{
  ushort uVar1;
  QLocaleData *pQVar2;
  long lVar3;
  DataPointer *pDVar4;
  array<char,_4UL> aVar5;
  storage_type *in_RCX;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QLatin1String local_58;
  QStringBuilder<QStringBuilder<QLatin1String_&,_QLatin1Char>,_QLatin1String> local_48;
  _Type local_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((char)separator < '\0') {
    badSeparatorWarning("name",separator);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).size = 0;
      return __return_storage_ptr__;
    }
    goto LAB_00308ab8;
  }
  aVar5 = QLocalePrivate::languageToCode
                    (((this->d).d.ptr)->m_data->m_language_id,(LanguageCodeTypes)0xffffffff);
  local_24[0] = aVar5._M_elems[0];
  local_24[1] = aVar5._M_elems[1];
  local_24[2] = aVar5._M_elems[2];
  local_24[3] = aVar5._M_elems[3];
  local_58.m_size = -1;
  do {
    pDVar4 = &((QString *)local_58.m_size)->d;
    local_58.m_size = (long)&(((QString *)local_58.m_size)->d).d + 1;
  } while ((local_24 + 1)[(long)&pDVar4->d] != '\0');
  local_58.m_data = local_24;
  pQVar2 = ((this->d).d.ptr)->m_data;
  if (pQVar2->m_language_id == 1) {
LAB_00308a4b:
    ba.m_data = in_RCX;
    ba.m_size = (qsizetype)local_24;
    QString::fromLatin1((QString *)&local_48,(QString *)local_58.m_size,ba);
    (__return_storage_ptr__->d).d = (Data *)local_48.a.a;
    (__return_storage_ptr__->d).ptr = (char16_t *)CONCAT71(local_48.a._9_7_,local_48.a.b.ch);
    (__return_storage_ptr__->d).size = local_48.b.m_size;
  }
  else {
    uVar1 = pQVar2->m_territory_id;
    if ((ulong)uVar1 == 0) goto LAB_00308a4b;
    local_48.b.m_size = 0;
    local_48.b.m_data = (char *)0x0;
    if (0xfefa < (ushort)(uVar1 - 0x106)) {
      lVar3 = (ulong)uVar1 * 3;
      local_48.b.m_data = (char *)("ZZ" + lVar3);
      local_48.b.m_size = 3 - (ulong)("ZZ"[lVar3 + 2] == '\0');
    }
    local_48.a.a = &local_58;
    local_48.a.b.ch = separator;
    QStringBuilder<QStringBuilder<QLatin1String_&,_QLatin1Char>,_QLatin1String>::convertTo<QString>
              (__return_storage_ptr__,&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
LAB_00308ab8:
  __stack_chk_fail();
}

Assistant:

QString QLocale::name(TagSeparator separator) const
{
    const char sep = char(separator);
    if (uchar(sep) > 0x7f) {
        badSeparatorWarning("name", sep);
        return {};
    }
    const auto code = d->languageCode();
    QLatin1StringView view{code.data()};

    Language l = language();
    if (l == C)
        return view;

    Territory c = territory();
    if (c == AnyTerritory)
        return view;

    return view + QLatin1Char(sep) + d->territoryCode();
}